

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O2

Glyph * __thiscall
sf::Font::loadGlyph(Glyph *__return_storage_ptr__,Font *this,Uint32 codePoint,uint characterSize,
                   bool bold,float outlineThickness)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer puVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  pointer puVar5;
  undefined4 uVar6;
  FT_Glyph pFVar7;
  bool bVar8;
  int iVar9;
  uint width;
  ostream *poVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong __new_size;
  long lVar15;
  float fVar16;
  IntRect IVar17;
  FT_Glyph glyphDesc;
  FT_Glyph local_68;
  ulong local_60;
  Page *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  IVar17 = (IntRect)ZEXT416(0);
  __return_storage_ptr__->textureRect = IVar17;
  *(IntRect *)&(__return_storage_ptr__->bounds).top = IVar17;
  __return_storage_ptr__->advance = (float)IVar17.left;
  __return_storage_ptr__->lsbDelta = IVar17.top;
  __return_storage_ptr__->rsbDelta = IVar17.width;
  (__return_storage_ptr__->bounds).left = (float)IVar17.height;
  pvVar3 = this->m_face;
  if (pvVar3 != (void *)0x0) {
    bVar8 = setCurrentSize(this,characterSize);
    if (bVar8) {
      iVar9 = FT_Load_Char(pvVar3,codePoint,(-(outlineThickness != 0.0) & 1U) * '\b' + ' ');
      if (iVar9 == 0) {
        iVar9 = FT_Get_Glyph(*(undefined8 *)((long)pvVar3 + 0x98),&glyphDesc);
        if (iVar9 == 0) {
          local_68 = (FT_Glyph)CONCAT44(local_68._4_4_,glyphDesc->format);
          if (glyphDesc->format == FT_GLYPH_FORMAT_OUTLINE) {
            if (bold) {
              FT_Outline_Embolden(glyphDesc + 1,0x40);
            }
            if ((outlineThickness != 0.0) || (NAN(outlineThickness))) {
              pvVar4 = this->m_stroker;
              FT_Stroker_Set(pvVar4,(long)(outlineThickness * 64.0),1,0,0);
              FT_Glyph_Stroke(&glyphDesc,pvVar4,1);
            }
          }
          FT_Glyph_To_Bitmap(&glyphDesc,0,0,1);
          pFVar7 = glyphDesc;
          if ((int)local_68 != 0x6f75746c) {
            if (bold) {
              FT_Bitmap_Embolden(this->m_library,&glyphDesc[1].clazz,0x40);
            }
            if ((outlineThickness != 0.0) || (NAN(outlineThickness))) {
              poVar10 = err();
              poVar10 = std::operator<<(poVar10,"Failed to outline glyph (no fallback available)");
              std::endl<char,std::char_traits<char>>(poVar10);
            }
          }
          fVar16 = (float)((pFVar7->advance).x >> 0x10);
          if (bold) {
            fVar16 = fVar16 + 1.0;
          }
          __return_storage_ptr__->advance = fVar16;
          uVar6 = *(undefined4 *)(*(long *)((long)pvVar3 + 0x98) + 0x118);
          __return_storage_ptr__->lsbDelta = *(undefined4 *)(*(long *)((long)pvVar3 + 0x98) + 0x110)
          ;
          __return_storage_ptr__->rsbDelta = uVar6;
          iVar9 = *(int *)&pFVar7[1].clazz;
          uVar13 = *(uint *)((long)&pFVar7[1].clazz + 4);
          if (iVar9 != 0 && uVar13 != 0) {
            width = uVar13 + 4;
            local_50 = (ulong)uVar13;
            local_58 = loadPage(this,characterSize);
            IVar17 = findGlyphRect(this,local_58,width,iVar9 + 4U);
            local_38 = IVar17._8_8_;
            local_60 = IVar17._0_8_;
            (__return_storage_ptr__->textureRect).left = IVar17.left + 2;
            local_40 = local_60 >> 0x20;
            (__return_storage_ptr__->textureRect).top = IVar17.top + 2;
            (__return_storage_ptr__->textureRect).width = IVar17.width + -4;
            local_48 = local_38 >> 0x20;
            (__return_storage_ptr__->textureRect).height = IVar17.height + -4;
            iVar2 = *(int *)((long)&pFVar7[1].library + 4);
            (__return_storage_ptr__->bounds).left = (float)*(int *)&pFVar7[1].library;
            (__return_storage_ptr__->bounds).top = (float)-iVar2;
            (__return_storage_ptr__->bounds).width = (float)*(uint *)((long)&pFVar7[1].clazz + 4);
            local_68 = pFVar7;
            (__return_storage_ptr__->bounds).height = (float)*(uint *)&pFVar7[1].clazz;
            this_00 = &this->m_pixelBuffer;
            __new_size = (ulong)((iVar9 + 4U) * width * 4);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,__new_size);
            puVar5 = (this->m_pixelBuffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            for (uVar14 = 0; __new_size != uVar14; uVar14 = uVar14 + 4) {
              puVar1 = puVar5 + uVar14;
              puVar1[0] = 0xff;
              puVar1[1] = 0xff;
              puVar1[2] = 0xff;
              puVar1[3] = '\0';
            }
            lVar11 = local_68[1].advance.x;
            iVar2 = (int)local_50;
            if (*(char *)((long)&local_68[1].advance.y + 2) == '\x01') {
              iVar12 = iVar2 * 2 + 10;
              for (uVar13 = 2; uVar13 < iVar9 + 2U; uVar13 = uVar13 + 1) {
                for (uVar14 = 0; uVar14 + 2 < (ulong)(iVar2 + 2); uVar14 = uVar14 + 1) {
                  (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start
                  [(ulong)(uint)(iVar12 + (int)uVar14) * 4 + 3] =
                       -((*(byte *)(lVar11 + (uVar14 >> 3 & 0x1fffffff)) >> (~(byte)uVar14 & 7) & 1)
                        != 0);
                }
                lVar11 = lVar11 + (int)local_68[1].format;
                iVar12 = iVar12 + width;
              }
            }
            else {
              iVar12 = iVar2 * 2 + 10;
              for (uVar13 = 2; uVar13 < iVar9 + 2U; uVar13 = uVar13 + 1) {
                for (lVar15 = 0; lVar15 + 2U < (ulong)(iVar2 + 2); lVar15 = lVar15 + 1) {
                  (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start
                  [(ulong)(uint)(iVar12 + (int)lVar15) * 4 + 3] = *(uchar *)(lVar11 + lVar15);
                }
                lVar11 = lVar11 + (int)local_68[1].format;
                iVar12 = iVar12 + width;
              }
            }
            Texture::update(&local_58->texture,
                            (this_00->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start,(uint)local_38,(uint)local_48,
                            (uint)local_60,(uint)local_40);
          }
          FT_Done_Glyph(glyphDesc);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Glyph Font::loadGlyph(Uint32 codePoint, unsigned int characterSize, bool bold, float outlineThickness) const
{
    // The glyph to return
    Glyph glyph;

    // First, transform our ugly void* to a FT_Face
    FT_Face face = static_cast<FT_Face>(m_face);
    if (!face)
        return glyph;

    // Set the character size
    if (!setCurrentSize(characterSize))
        return glyph;

    // Load the glyph corresponding to the code point
    FT_Int32 flags = FT_LOAD_TARGET_NORMAL | FT_LOAD_FORCE_AUTOHINT;
    if (outlineThickness != 0)
        flags |= FT_LOAD_NO_BITMAP;
    if (FT_Load_Char(face, codePoint, flags) != 0)
        return glyph;

    // Retrieve the glyph
    FT_Glyph glyphDesc;
    if (FT_Get_Glyph(face->glyph, &glyphDesc) != 0)
        return glyph;

    // Apply bold and outline (there is no fallback for outline) if necessary -- first technique using outline (highest quality)
    FT_Pos weight = 1 << 6;
    bool outline = (glyphDesc->format == FT_GLYPH_FORMAT_OUTLINE);
    if (outline)
    {
        if (bold)
        {
            FT_OutlineGlyph outlineGlyph = reinterpret_cast<FT_OutlineGlyph>(glyphDesc);
            FT_Outline_Embolden(&outlineGlyph->outline, weight);
        }

        if (outlineThickness != 0)
        {
            FT_Stroker stroker = static_cast<FT_Stroker>(m_stroker);

            FT_Stroker_Set(stroker, static_cast<FT_Fixed>(outlineThickness * static_cast<float>(1 << 6)), FT_STROKER_LINECAP_ROUND, FT_STROKER_LINEJOIN_ROUND, 0);
            FT_Glyph_Stroke(&glyphDesc, stroker, true);
        }
    }

    // Convert the glyph to a bitmap (i.e. rasterize it)
    // Warning! After this line, do not read any data from glyphDesc directly, use
    // bitmapGlyph.root to access the FT_Glyph data.
    FT_Glyph_To_Bitmap(&glyphDesc, FT_RENDER_MODE_NORMAL, 0, 1);
    FT_BitmapGlyph bitmapGlyph = reinterpret_cast<FT_BitmapGlyph>(glyphDesc);
    FT_Bitmap& bitmap = bitmapGlyph->bitmap;

    // Apply bold if necessary -- fallback technique using bitmap (lower quality)
    if (!outline)
    {
        if (bold)
            FT_Bitmap_Embolden(static_cast<FT_Library>(m_library), &bitmap, weight, weight);

        if (outlineThickness != 0)
            err() << "Failed to outline glyph (no fallback available)" << std::endl;
    }

    // Compute the glyph's advance offset
    glyph.advance = static_cast<float>(bitmapGlyph->root.advance.x >> 16);
    if (bold)
        glyph.advance += static_cast<float>(weight) / static_cast<float>(1 << 6);

    glyph.lsbDelta = static_cast<int>(face->glyph->lsb_delta);
    glyph.rsbDelta = static_cast<int>(face->glyph->rsb_delta);

    unsigned int width  = bitmap.width;
    unsigned int height = bitmap.rows;

    if ((width > 0) && (height > 0))
    {
        // Leave a small padding around characters, so that filtering doesn't
        // pollute them with pixels from neighbors
        const unsigned int padding = 2;

        width += 2 * padding;
        height += 2 * padding;

        // Get the glyphs page corresponding to the character size
        Page& page = loadPage(characterSize);

        // Find a good position for the new glyph into the texture
        glyph.textureRect = findGlyphRect(page, width, height);

        // Make sure the texture data is positioned in the center
        // of the allocated texture rectangle
        glyph.textureRect.left   += static_cast<int>(padding);
        glyph.textureRect.top    += static_cast<int>(padding);
        glyph.textureRect.width  -= static_cast<int>(2 * padding);
        glyph.textureRect.height -= static_cast<int>(2 * padding);

        // Compute the glyph's bounding box
        glyph.bounds.left   = static_cast<float>( bitmapGlyph->left);
        glyph.bounds.top    = static_cast<float>(-bitmapGlyph->top);
        glyph.bounds.width  = static_cast<float>( bitmap.width);
        glyph.bounds.height = static_cast<float>( bitmap.rows);

        // Resize the pixel buffer to the new size and fill it with transparent white pixels
        m_pixelBuffer.resize(width * height * 4);

        Uint8* current = &m_pixelBuffer[0];
        Uint8* end = current + width * height * 4;

        while (current != end)
        {
            (*current++) = 255;
            (*current++) = 255;
            (*current++) = 255;
            (*current++) = 0;
        }

        // Extract the glyph's pixels from the bitmap
        const Uint8* pixels = bitmap.buffer;
        if (bitmap.pixel_mode == FT_PIXEL_MODE_MONO)
        {
            // Pixels are 1 bit monochrome values
            for (unsigned int y = padding; y < height - padding; ++y)
            {
                for (unsigned int x = padding; x < width - padding; ++x)
                {
                    // The color channels remain white, just fill the alpha channel
                    std::size_t index = x + y * width;
                    m_pixelBuffer[index * 4 + 3] = ((pixels[(x - padding) / 8]) & (1 << (7 - ((x - padding) % 8)))) ? 255 : 0;
                }
                pixels += bitmap.pitch;
            }
        }
        else
        {
            // Pixels are 8 bits gray levels
            for (unsigned int y = padding; y < height - padding; ++y)
            {
                for (unsigned int x = padding; x < width - padding; ++x)
                {
                    // The color channels remain white, just fill the alpha channel
                    std::size_t index = x + y * width;
                    m_pixelBuffer[index * 4 + 3] = pixels[x - padding];
                }
                pixels += bitmap.pitch;
            }
        }

        // Write the pixels to the texture
        unsigned int x = static_cast<unsigned int>(glyph.textureRect.left) - padding;
        unsigned int y = static_cast<unsigned int>(glyph.textureRect.top) - padding;
        unsigned int w = static_cast<unsigned int>(glyph.textureRect.width) + 2 * padding;
        unsigned int h = static_cast<unsigned int>(glyph.textureRect.height) + 2 * padding;
        page.texture.update(&m_pixelBuffer[0], w, h, x, y);
    }

    // Delete the FT glyph
    FT_Done_Glyph(glyphDesc);

    // Done :)
    return glyph;
}